

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlanningUnitMADPDiscrete.cpp
# Opt level: O1

vector<unsigned_int,_std::allocator<unsigned_int>_> * __thiscall
PlanningUnitMADPDiscrete::JointToIndividualActionObservationHistoryIndicesRef
          (PlanningUnitMADPDiscrete *this,LIndex jaohI)

{
  Index IVar1;
  JointActionObservationHistory *pJVar2;
  ostream *poVar3;
  undefined8 *puVar4;
  stringstream ss;
  stringstream asStack_198 [16];
  ostream local_188 [376];
  
  if (jaohI < this->_m_nrJointActionObservationHistories) {
    IVar1 = Globals::CastLIndexToIndex(jaohI);
    pJVar2 = JointActionObservationHistoryTree::GetJointActionObservationHistory
                       ((this->_m_jointActionObservationHistoryTreeVector).
                        super__Vector_base<JointActionObservationHistoryTree_*,_std::allocator<JointActionObservationHistoryTree_*>_>
                        ._M_impl.super__Vector_impl_data._M_start[IVar1]);
    return &pJVar2->_m_individualActionObservationHistories;
  }
  std::__cxx11::stringstream::stringstream(asStack_198);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_188,"PlanningUnitMADPDiscrete::JointToIndividualActionActObserva",0x3b);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_188,"tionHistory Indices ERROR: index (",0x22);
  poVar3 = std::ostream::_M_insert<unsigned_long_long>((ulonglong)local_188);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,") out of bounds!",0x10);
  std::endl<char,std::char_traits<char>>(poVar3);
  puVar4 = (undefined8 *)__cxa_allocate_exception(0x28);
  *puVar4 = &PTR__E_0059bd80;
  std::__cxx11::stringbuf::str();
  __cxa_throw(puVar4,&E::typeinfo,E::~E);
}

Assistant:

const vector<Index>&
PlanningUnitMADPDiscrete::JointToIndividualActionObservationHistoryIndicesRef(
        LIndex jaohI) const
{    
    if(jaohI < _m_nrJointActionObservationHistories)
    {
        JointActionObservationHistoryTree* jaoht = 
            _m_jointActionObservationHistoryTreeVector[CastLIndexToIndex(jaohI)];
        return(jaoht->GetJointActionObservationHistory()->
                GetIndividualActionObservationHistoryIndices());
    }
    else
    {
        stringstream ss;
        ss << "PlanningUnitMADPDiscrete::JointToIndividualActionActObserva"<<
            "tionHistory Indices ERROR: index ("<< jaohI <<
            ") out of bounds!"<<endl;
        throw E(ss); 
    }
}